

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_JP2K.cpp
# Opt level: O2

ASDCP * __thiscall
ASDCP::MD_to_JP2K_PDesc
          (ASDCP *this,GenericPictureEssenceDescriptor *EssenceDescriptor,
          JPEG2000PictureSubDescriptor *EssenceSubDescriptor,Rational *EditRate,Rational *SampleRate
          ,PictureDescriptor *PDesc)

{
  ui16_t *__result;
  uint uVar1;
  ulong uVar2;
  ArchivableUi16 *pAVar3;
  ArchivableUi16 *pAVar4;
  CodingStyleDefault_t *pCVar5;
  ui32_t uVar6;
  ui32_t uVar7;
  ui32_t uVar8;
  byte_t *pbVar9;
  ILogSink *this_00;
  long lVar10;
  
  memset(PDesc,0,0x1d8);
  PDesc->EditRate = *EditRate;
  PDesc->SampleRate = *SampleRate;
  if ((EssenceDescriptor->super_FileDescriptor).ContainerDuration.m_has_value == true) {
    uVar2 = (EssenceDescriptor->super_FileDescriptor).ContainerDuration.m_property;
    if (uVar2 >> 0x20 != 0) {
      __assert_fail("EssenceDescriptor.ContainerDuration.const_get() <= 0xFFFFFFFFL",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_JP2K.cpp"
                    ,0x194,
                    "ASDCP::Result_t ASDCP::MD_to_JP2K_PDesc(const ASDCP::MXF::GenericPictureEssenceDescriptor &, const ASDCP::MXF::JPEG2000PictureSubDescriptor &, const ASDCP::Rational &, const ASDCP::Rational &, ASDCP::JP2K::PictureDescriptor &)"
                   );
    }
    PDesc->ContainerDuration = (ui32_t)uVar2;
  }
  uVar6 = EssenceDescriptor->StoredHeight;
  PDesc->StoredWidth = EssenceDescriptor->StoredWidth;
  PDesc->StoredHeight = uVar6;
  PDesc->AspectRatio = (EssenceDescriptor->AspectRatio).super_Rational;
  PDesc->Rsize = EssenceSubDescriptor->Rsize;
  uVar6 = EssenceSubDescriptor->Ysize;
  uVar7 = EssenceSubDescriptor->XOsize;
  uVar8 = EssenceSubDescriptor->YOsize;
  PDesc->Xsize = EssenceSubDescriptor->Xsize;
  PDesc->Ysize = uVar6;
  PDesc->XOsize = uVar7;
  PDesc->YOsize = uVar8;
  uVar6 = EssenceSubDescriptor->YTsize;
  uVar7 = EssenceSubDescriptor->XTOsize;
  uVar8 = EssenceSubDescriptor->YTOsize;
  PDesc->XTsize = EssenceSubDescriptor->XTsize;
  PDesc->YTsize = uVar6;
  PDesc->XTOsize = uVar7;
  PDesc->YTOsize = uVar8;
  PDesc->Csize = EssenceSubDescriptor->Csize;
  uVar1 = *(uint *)&(EssenceSubDescriptor->PictureComponentSizing).m_property.field_0x14;
  if (uVar1 == 0x11) {
    pbVar9 = Kumu::ByteString::RoData((ByteString *)&EssenceSubDescriptor->PictureComponentSizing);
    *(undefined8 *)PDesc->ImageComponents = *(undefined8 *)(pbVar9 + 8);
    PDesc->ImageComponents[2].YRsize = pbVar9[0x10];
  }
  else {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Warn
              (this_00,"Unexpected PictureComponentSizing size: %u, should be 17.\n",(ulong)uVar1);
  }
  pCVar5 = &PDesc->CodingStyleDefault;
  (pCVar5->SPcod).PrecinctSize[0x10] = '\0';
  (pCVar5->SPcod).PrecinctSize[0x11] = '\0';
  (pCVar5->SPcod).PrecinctSize[0x12] = '\0';
  (pCVar5->SPcod).PrecinctSize[0x13] = '\0';
  (pCVar5->SPcod).PrecinctSize[0x14] = '\0';
  (pCVar5->SPcod).PrecinctSize[0x15] = '\0';
  (pCVar5->SPcod).PrecinctSize[0x16] = '\0';
  (pCVar5->SPcod).PrecinctSize[0x17] = '\0';
  pCVar5 = &PDesc->CodingStyleDefault;
  (pCVar5->SPcod).PrecinctSize[0x18] = '\0';
  (pCVar5->SPcod).PrecinctSize[0x19] = '\0';
  (pCVar5->SPcod).PrecinctSize[0x1a] = '\0';
  (pCVar5->SPcod).PrecinctSize[0x1b] = '\0';
  (pCVar5->SPcod).PrecinctSize[0x1c] = '\0';
  (pCVar5->SPcod).PrecinctSize[0x1d] = '\0';
  (pCVar5->SPcod).PrecinctSize[0x1e] = '\0';
  (pCVar5->SPcod).PrecinctSize[0x1f] = '\0';
  pCVar5 = &PDesc->CodingStyleDefault;
  (pCVar5->SPcod).PrecinctSize[6] = '\0';
  (pCVar5->SPcod).PrecinctSize[7] = '\0';
  (pCVar5->SPcod).PrecinctSize[8] = '\0';
  (pCVar5->SPcod).PrecinctSize[9] = '\0';
  (pCVar5->SPcod).PrecinctSize[10] = '\0';
  (pCVar5->SPcod).PrecinctSize[0xb] = '\0';
  (pCVar5->SPcod).PrecinctSize[0xc] = '\0';
  (pCVar5->SPcod).PrecinctSize[0xd] = '\0';
  pCVar5 = &PDesc->CodingStyleDefault;
  (pCVar5->SPcod).PrecinctSize[0xe] = '\0';
  (pCVar5->SPcod).PrecinctSize[0xf] = '\0';
  (pCVar5->SPcod).PrecinctSize[0x10] = '\0';
  (pCVar5->SPcod).PrecinctSize[0x11] = '\0';
  (pCVar5->SPcod).PrecinctSize[0x12] = '\0';
  (pCVar5->SPcod).PrecinctSize[0x13] = '\0';
  (pCVar5->SPcod).PrecinctSize[0x14] = '\0';
  (pCVar5->SPcod).PrecinctSize[0x15] = '\0';
  (PDesc->CodingStyleDefault).Scod = '\0';
  (PDesc->CodingStyleDefault).SGcod.ProgressionOrder = '\0';
  (PDesc->CodingStyleDefault).SGcod.NumberOfLayers[0] = '\0';
  (PDesc->CodingStyleDefault).SGcod.NumberOfLayers[1] = '\0';
  (PDesc->CodingStyleDefault).SGcod.MultiCompTransform = '\0';
  (PDesc->CodingStyleDefault).SPcod.DecompositionLevels = '\0';
  (PDesc->CodingStyleDefault).SPcod.CodeblockWidth = '\0';
  (PDesc->CodingStyleDefault).SPcod.CodeblockHeight = '\0';
  (PDesc->CodingStyleDefault).SPcod.CodeblockStyle = '\0';
  (PDesc->CodingStyleDefault).SPcod.Transformation = '\0';
  (PDesc->CodingStyleDefault).SPcod.PrecinctSize[0] = '\0';
  (PDesc->CodingStyleDefault).SPcod.PrecinctSize[1] = '\0';
  (PDesc->CodingStyleDefault).SPcod.PrecinctSize[2] = '\0';
  (PDesc->CodingStyleDefault).SPcod.PrecinctSize[3] = '\0';
  (PDesc->CodingStyleDefault).SPcod.PrecinctSize[4] = '\0';
  (PDesc->CodingStyleDefault).SPcod.PrecinctSize[5] = '\0';
  pbVar9 = Kumu::ByteString::RoData((ByteString *)&EssenceSubDescriptor->CodingStyleDefault);
  memcpy(&PDesc->CodingStyleDefault,pbVar9,
         (ulong)*(uint *)&(EssenceSubDescriptor->CodingStyleDefault).m_property.field_0x14);
  memset(&PDesc->QuantizationDefault,0,0x102);
  pbVar9 = Kumu::ByteString::RoData((ByteString *)&EssenceSubDescriptor->QuantizationDefault);
  memcpy(&PDesc->QuantizationDefault,pbVar9,
         (ulong)*(uint *)&(EssenceSubDescriptor->QuantizationDefault).m_property.field_0x14);
  (PDesc->QuantizationDefault).SPqcdLength =
       (EssenceSubDescriptor->QuantizationDefault).m_property.field_0x14 + 0xff;
  __result = (PDesc->Profile).Pprf;
  for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 2) {
    *(undefined2 *)((long)__result + lVar10) = 0;
  }
  if ((EssenceSubDescriptor->J2KProfile).m_has_value == true) {
    pAVar3 = (EssenceSubDescriptor->J2KProfile).m_property.
             super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
             .super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>.
             super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>._M_impl
             .super__Vector_impl_data._M_start;
    pAVar4 = *(pointer *)
              ((long)&(EssenceSubDescriptor->J2KProfile).m_property.
                      super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
                      .super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>.
                      super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>
                      ._M_impl.super__Vector_impl_data + 8);
    if (pAVar4 == pAVar3) goto LAB_001c5b22;
    (PDesc->Profile).N = (ui16_t)((uint)((int)pAVar4 - (int)pAVar3) >> 4);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<Kumu::ArchivableUi16_const*,unsigned_short*>(pAVar3,pAVar4,__result);
  }
  else {
LAB_001c5b22:
    (PDesc->Profile).N = 0;
  }
  for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 2) {
    *(undefined2 *)((long)(PDesc->CorrespondingProfile).Pcpf + lVar10) = 0;
  }
  if ((EssenceSubDescriptor->J2KCorrespondingProfile).m_has_value == true) {
    pAVar3 = (EssenceSubDescriptor->J2KCorrespondingProfile).m_property.
             super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
             .super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>.
             super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>._M_impl
             .super__Vector_impl_data._M_start;
    pAVar4 = *(pointer *)
              ((long)&(EssenceSubDescriptor->J2KCorrespondingProfile).m_property.
                      super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
                      .super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>.
                      super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>
                      ._M_impl.super__Vector_impl_data + 8);
    if (pAVar4 != pAVar3) {
      (PDesc->CorrespondingProfile).N = (ui16_t)((uint)((int)pAVar4 - (int)pAVar3) >> 4);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<Kumu::ArchivableUi16_const*,unsigned_short*>
                (pAVar3,pAVar4,(PDesc->CorrespondingProfile).Pcpf);
      goto LAB_001c5b86;
    }
  }
  (PDesc->CorrespondingProfile).N = 0;
LAB_001c5b86:
  for (lVar10 = 0; lVar10 != 0x40; lVar10 = lVar10 + 2) {
    *(undefined2 *)((long)(PDesc->ExtendedCapabilities).Ccap + lVar10) = 0;
  }
  if ((EssenceSubDescriptor->J2KExtendedCapabilities).m_has_value == false) {
    (PDesc->ExtendedCapabilities).Pcap = 0;
    (PDesc->ExtendedCapabilities).N = -1;
  }
  else {
    (PDesc->ExtendedCapabilities).Pcap =
         (EssenceSubDescriptor->J2KExtendedCapabilities).m_property.Pcap;
    pAVar3 = (EssenceSubDescriptor->J2KExtendedCapabilities).m_property.Ccap.
             super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
             .super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>.
             super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>._M_impl
             .super__Vector_impl_data._M_start;
    pAVar4 = *(pointer *)
              ((long)&(EssenceSubDescriptor->J2KExtendedCapabilities).m_property.Ccap.
                      super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
                      .super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>.
                      super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>
                      ._M_impl + 8);
    (PDesc->ExtendedCapabilities).N = (i8_t)((uint)((int)pAVar4 - (int)pAVar3) >> 4);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<Kumu::ArchivableUi16_const*,unsigned_short*>
              (pAVar3,pAVar4,(PDesc->ExtendedCapabilities).Ccap);
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MD_to_JP2K_PDesc(const ASDCP::MXF::GenericPictureEssenceDescriptor&  EssenceDescriptor,
			const ASDCP::MXF::JPEG2000PictureSubDescriptor& EssenceSubDescriptor,
			const ASDCP::Rational& EditRate, const ASDCP::Rational& SampleRate,
			ASDCP::JP2K::PictureDescriptor& PDesc)
{
  memset(&PDesc, 0, sizeof(PDesc));

  PDesc.EditRate           = EditRate;
  PDesc.SampleRate         = SampleRate;
  if ( ! EssenceDescriptor.ContainerDuration.empty() )
    {
      assert(EssenceDescriptor.ContainerDuration.const_get() <= 0xFFFFFFFFL);
      PDesc.ContainerDuration  = static_cast<ui32_t>(EssenceDescriptor.ContainerDuration.const_get());
    }
  PDesc.StoredWidth        = EssenceDescriptor.StoredWidth;
  PDesc.StoredHeight       = EssenceDescriptor.StoredHeight;
  PDesc.AspectRatio        = EssenceDescriptor.AspectRatio;

  PDesc.Rsize   = EssenceSubDescriptor.Rsize;
  PDesc.Xsize   = EssenceSubDescriptor.Xsize;
  PDesc.Ysize   = EssenceSubDescriptor.Ysize;
  PDesc.XOsize  = EssenceSubDescriptor.XOsize;
  PDesc.YOsize  = EssenceSubDescriptor.YOsize;
  PDesc.XTsize  = EssenceSubDescriptor.XTsize;
  PDesc.YTsize  = EssenceSubDescriptor.YTsize;
  PDesc.XTOsize = EssenceSubDescriptor.XTOsize;
  PDesc.YTOsize = EssenceSubDescriptor.YTOsize;
  PDesc.Csize   = EssenceSubDescriptor.Csize;

  // PictureComponentSizing
  ui32_t tmp_size = EssenceSubDescriptor.PictureComponentSizing.const_get().Length();

  if ( tmp_size == 17 ) // ( 2 * sizeof(ui32_t) ) + 3 components * 3 byte each
    {
      memcpy(&PDesc.ImageComponents, EssenceSubDescriptor.PictureComponentSizing.const_get().RoData() + 8, tmp_size - 8);
    }
  else
    {
      DefaultLogSink().Warn("Unexpected PictureComponentSizing size: %u, should be 17.\n", tmp_size);
    }

  // CodingStyleDefault
  memset(&PDesc.CodingStyleDefault, 0, sizeof(CodingStyleDefault_t));
  memcpy(&PDesc.CodingStyleDefault,
	 EssenceSubDescriptor.CodingStyleDefault.const_get().RoData(),
	 EssenceSubDescriptor.CodingStyleDefault.const_get().Length());

  // QuantizationDefault
  memset(&PDesc.QuantizationDefault, 0, sizeof(QuantizationDefault_t));
  memcpy(&PDesc.QuantizationDefault,
	 EssenceSubDescriptor.QuantizationDefault.const_get().RoData(),
	 EssenceSubDescriptor.QuantizationDefault.const_get().Length());
  
  PDesc.QuantizationDefault.SPqcdLength = EssenceSubDescriptor.QuantizationDefault.const_get().Length() - 1;

  // Profile

  std::fill(PDesc.Profile.Pprf, PDesc.Profile.Pprf + JP2K::MaxPRFN, 0);

  if (EssenceSubDescriptor.J2KProfile.empty() ||
	  EssenceSubDescriptor.J2KProfile.const_get().size() == 0) {

	  PDesc.Profile.N = 0;

  } else {

	  PDesc.Profile.N = EssenceSubDescriptor.J2KProfile.const_get().size();

	  std::copy(EssenceSubDescriptor.J2KProfile.const_get().begin(),
		  EssenceSubDescriptor.J2KProfile.const_get().end(),
		  PDesc.Profile.Pprf);

  }

  // Corresponding profile

  std::fill(PDesc.CorrespondingProfile.Pcpf, PDesc.CorrespondingProfile.Pcpf + JP2K::MaxCPFN, 0);

  if (EssenceSubDescriptor.J2KCorrespondingProfile.empty() ||
	  EssenceSubDescriptor.J2KCorrespondingProfile.const_get().size() == 0) {

	  PDesc.CorrespondingProfile.N = 0;

  }
  else {

	  PDesc.CorrespondingProfile.N = EssenceSubDescriptor.J2KCorrespondingProfile.const_get().size();

	  std::copy(EssenceSubDescriptor.J2KCorrespondingProfile.const_get().begin(),
		  EssenceSubDescriptor.J2KCorrespondingProfile.const_get().end(),
		  PDesc.CorrespondingProfile.Pcpf);

  }

  // Extended capabilities

  std::fill(PDesc.ExtendedCapabilities.Ccap, PDesc.ExtendedCapabilities.Ccap + JP2K::MaxCapabilities, 0);

  if (EssenceSubDescriptor.J2KExtendedCapabilities.empty()) {

	  PDesc.ExtendedCapabilities.Pcap = 0;
	  PDesc.ExtendedCapabilities.N = JP2K::NoExtendedCapabilitiesSignaled;

  }
  else {

	  PDesc.ExtendedCapabilities.Pcap = EssenceSubDescriptor.J2KExtendedCapabilities.const_get().Pcap;
	  PDesc.ExtendedCapabilities.N = EssenceSubDescriptor.J2KExtendedCapabilities.const_get().Ccap.size();

	  std::copy(EssenceSubDescriptor.J2KExtendedCapabilities.const_get().Ccap.begin(),
		  EssenceSubDescriptor.J2KExtendedCapabilities.const_get().Ccap.end(),
		  PDesc.ExtendedCapabilities.Ccap);

  }

  return RESULT_OK;
}